

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SerialQueue.cpp
# Opt level: O1

void __thiscall anon_unknown.dwarf_144ada::SerialQueueImpl::SerialQueueImpl(SerialQueueImpl *this)

{
  pointer __p;
  long *local_20;
  
  (this->operations).
  super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
  super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  (this->operations).
  super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
  super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  (this->operations).
  super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
  super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (this->operations).
  super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
  super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (this->operations).
  super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
  super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (this->operations).
  super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
  super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (this->operations).
  super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
  super__Deque_impl_data._M_map_size = 0;
  (this->operations).
  super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
  super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (this->operationsThread)._M_t.
  super___uniq_ptr_impl<std::thread,_std::default_delete<std::thread>_>._M_t.
  super__Tuple_impl<0UL,_std::thread_*,_std::default_delete<std::thread>_>.
  super__Head_base<0UL,_std::thread_*,_false>._M_head_impl = (thread *)0x0;
  (this->operations).
  super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
  super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (this->operations).
  super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
  super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  std::_Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::
  _M_initialize_map(&(this->operations).
                     super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>
                    ,0);
  (this->operationsMutex).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  *(undefined8 *)((long)&(this->operationsMutex).super___mutex_base._M_mutex + 0x10) = 0;
  (this->operationsMutex).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->operationsMutex).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->operationsMutex).super___mutex_base._M_mutex + 8) = 0;
  std::condition_variable::condition_variable(&this->readyOperationsCondition);
  __p = (pointer)operator_new(8);
  (__p->_M_id)._M_thread = 0;
  local_20 = (long *)operator_new(0x20);
  *local_20 = (long)&PTR___State_001d5ef8;
  local_20[1] = (long)this;
  local_20[2] = (long)run;
  local_20[3] = 0;
  std::thread::_M_start_thread(__p,&local_20,0);
  if (local_20 != (long *)0x0) {
    (**(code **)(*local_20 + 8))();
  }
  std::__uniq_ptr_impl<std::thread,_std::default_delete<std::thread>_>::reset
            ((__uniq_ptr_impl<std::thread,_std::default_delete<std::thread>_> *)this,__p);
  return;
}

Assistant:

SerialQueueImpl() {
    // Ensure the queue is fully initialized before creating the worker thread.
    operationsThread = llvm::make_unique<std::thread>(
        &SerialQueueImpl::run, this);
  }